

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
flatbuffers::ResizeContext::ResizeContext
          (ResizeContext *this,Schema *schema,uoffset_t start,int delta,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  uint *first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint uVar1;
  ulong in_RAX;
  size_type_conflict __n;
  Table *table;
  const_iterator __last;
  undefined8 uStack_38;
  
  this->schema_ = schema;
  this->startptr_ =
       (flatbuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start + start;
  this->delta_ = delta;
  this->buf_ = flatbuf;
  uStack_38 = in_RAX & 0xffffffffffffff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->dag_check_,
             (ulong)((long)(flatbuf->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(flatbuf->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start) >> 2,
             (value_type_conflict1 *)((long)&uStack_38 + 7),(allocator_type *)((long)&uStack_38 + 6)
            );
  uVar1 = this->delta_ + 7U & 0xfffffff8;
  this->delta_ = uVar1;
  if (uVar1 != 0) {
    first = (uint *)(this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    if (first == (uint *)0x0) {
      table = (Table *)0x0;
    }
    else {
      table = (Table *)((ulong)*first + (long)first);
    }
    Straddle<unsigned_int,1>(this,first,table,first);
    if (root_table == (Object *)0x0) {
      root_table = reflection::Schema::root_table(schema);
    }
    ResizeTable(this,root_table,table);
    __n = (size_type_conflict)this->delta_;
    this_00 = this->buf_;
    __last._M_current =
         (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start + start;
    if ((long)__n < 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (this_00,(const_iterator)(__last._M_current + __n),__last);
    }
    else {
      uStack_38._0_6_ = (uint6)(uint5)uStack_38;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                (this_00,__last,__n,(value_type_conflict1 *)((long)&uStack_38 + 5));
    }
  }
  return;
}

Assistant:

ResizeContext(const reflection::Schema &schema, uoffset_t start, int delta,
                std::vector<uint8_t> *flatbuf,
                const reflection::Object *root_table = nullptr)
      : schema_(schema),
        startptr_(flatbuf->data() + start),
        delta_(delta),
        buf_(*flatbuf),
        dag_check_(flatbuf->size() / sizeof(uoffset_t), false) {
    auto mask = static_cast<int>(sizeof(largest_scalar_t) - 1);
    delta_ = (delta_ + mask) & ~mask;
    if (!delta_) return;  // We can't shrink by less than largest_scalar_t.
    // Now change all the offsets by delta_.
    auto root = GetAnyRoot(buf_.data());
    Straddle<uoffset_t, 1>(buf_.data(), root, buf_.data());
    ResizeTable(root_table ? *root_table : *schema.root_table(), root);
    // We can now add or remove bytes at start.
    if (delta_ > 0)
      buf_.insert(buf_.begin() + start, delta_, 0);
    else
      buf_.erase(buf_.begin() + start + delta_, buf_.begin() + start);
  }